

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  string_t target_value_00;
  string_t target_value_01;
  string_t target_value_02;
  string_t target_value_03;
  string_t target_value_04;
  bool bVar1;
  StandardWriterPageState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator> *pSVar2;
  ValidityMask *this_00;
  string_t *psVar3;
  WriteStream *writer;
  ClientContext *pCVar4;
  InternalException *this_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  BssEncoder *in_RDI;
  ulong in_R9;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  ulong in_stack_00000008;
  string_t target_value_4;
  idx_t r_3;
  string_t target_value_3;
  string_t target_value_2;
  idx_t r_2;
  string_t target_value_1;
  string_t target_value;
  idx_t r_1;
  uint32_t value_index;
  string_t *src_value;
  idx_t r;
  string_t *data_ptr;
  ValidityMask *mask;
  StandardWriterPageState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
  *page_state;
  WriteStream *in_stack_00007e68;
  ValidityMask *in_stack_00007e70;
  idx_t in_stack_00007e78;
  idx_t in_stack_00007e80;
  ColumnWriterStatistics *in_stack_00007e88;
  Vector *in_stack_00007e90;
  undefined7 in_stack_fffffffffffffe28;
  uchar in_stack_fffffffffffffe2f;
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
  *in_stack_fffffffffffffe30;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe38;
  allocator *paVar5;
  RleBpEncoder *in_stack_fffffffffffffe40;
  Allocator *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  string_t *in_stack_fffffffffffffe70;
  WriteStream *in_stack_fffffffffffffe78;
  DbpEncoder *in_stack_fffffffffffffe80;
  Allocator *in_stack_fffffffffffffe88;
  DlbaEncoder *in_stack_fffffffffffffe90;
  ulong local_138;
  ulong local_d0;
  ulong local_68;
  ulong local_50;
  
  pSVar2 = ColumnWriterPageState::
           Cast<duckdb::StandardWriterPageState<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator>>
                     ((ColumnWriterPageState *)in_stack_fffffffffffffe30);
  this_00 = FlatVector::Validity((Vector *)0x60460e);
  psVar3 = FlatVector::GetData<duckdb::string_t>((Vector *)0x604623);
  writer = (WriteStream *)(ulong)pSVar2->encoding;
  switch(writer) {
  case (WriteStream *)0x0:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                      ((TemplatedValidityMask<unsigned_long> *)this_00);
    if (bVar1) {
      TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator,true>
                (in_stack_00007e90,in_stack_00007e88,in_stack_00007e80,in_stack_00007e78,
                 in_stack_00007e70,in_stack_00007e68);
    }
    else {
      TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator,false>
                (in_stack_00007e90,in_stack_00007e88,in_stack_00007e80,in_stack_00007e78,
                 in_stack_00007e70,in_stack_00007e68);
    }
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    paVar5 = (allocator *)&stack0xfffffffffffffe77;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe78,"Unknown encoding",paVar5);
    duckdb::InternalException::InternalException(this_01,(string *)&stack0xfffffffffffffe78);
    __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
  case (WriteStream *)0x5:
    local_68 = in_R9;
    if ((pSVar2->dbp_initialized & 1U) == 0) {
      for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
        if (bVar1) {
          input.value.pointer.ptr = (char *)extraout_RDX;
          input.value._0_8_ = psVar3[local_68].value.pointer.ptr;
          ParquetBaseStringOperator::Operation<duckdb::string_t,duckdb::string_t>
                    (*(ParquetBaseStringOperator **)&psVar3[local_68].value,input);
          target_value_00.value.pointer.ptr = (char *)in_stack_fffffffffffffe40;
          target_value_00.value._0_8_ = in_stack_fffffffffffffe38;
          ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                    ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_00);
          DbpEncoder::BeginWrite<duckdb::string_t>
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          pSVar2->dbp_initialized = true;
          local_68 = local_68 + 1;
          break;
        }
      }
    }
    for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      if (bVar1) {
        input_00.value.pointer.ptr = (char *)extraout_RDX_00;
        input_00.value._0_8_ = psVar3[local_68].value.pointer.ptr;
        ParquetBaseStringOperator::Operation<duckdb::string_t,duckdb::string_t>
                  (*(ParquetBaseStringOperator **)&psVar3[local_68].value,input_00);
        target_value_01.value.pointer.ptr = (char *)in_stack_fffffffffffffe40;
        target_value_01.value._0_8_ = in_stack_fffffffffffffe38;
        ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                  ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_01);
        DbpEncoder::WriteValue<duckdb::string_t>
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      }
    }
    break;
  case (WriteStream *)0x6:
    local_d0 = in_R9;
    if ((pSVar2->dlba_initialized & 1U) == 0) {
      for (; local_d0 < in_stack_00000008; local_d0 = local_d0 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
        if (bVar1) {
          input_01.value.pointer.ptr = (char *)extraout_RDX_01;
          input_01.value._0_8_ = psVar3[local_d0].value.pointer.ptr;
          ParquetBaseStringOperator::Operation<duckdb::string_t,duckdb::string_t>
                    (*(ParquetBaseStringOperator **)&psVar3[local_d0].value,input_01);
          target_value_02.value.pointer.ptr = (char *)in_stack_fffffffffffffe40;
          target_value_02.value._0_8_ = in_stack_fffffffffffffe38;
          ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                    ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_02);
          pCVar4 = ParquetWriter::GetContext((ParquetWriter *)in_RDI->bit_width);
          duckdb::BufferAllocator::Get(pCVar4);
          DlbaEncoder::BeginWrite<duckdb::string_t>
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     (WriteStream *)in_stack_fffffffffffffe80,(string_t *)in_stack_fffffffffffffe78)
          ;
          pSVar2->dlba_initialized = true;
          local_d0 = local_d0 + 1;
          break;
        }
      }
    }
    for (; local_d0 < in_stack_00000008; local_d0 = local_d0 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      if (bVar1) {
        input_02.value.pointer.ptr = (char *)extraout_RDX_02;
        input_02.value._0_8_ = psVar3[local_d0].value.pointer.ptr;
        ParquetBaseStringOperator::Operation<duckdb::string_t,duckdb::string_t>
                  (*(ParquetBaseStringOperator **)&psVar3[local_d0].value,input_02);
        target_value_03.value.pointer.ptr = (char *)in_stack_fffffffffffffe40;
        target_value_03.value._0_8_ = in_stack_fffffffffffffe38;
        ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                  ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_03);
        DlbaEncoder::WriteValue<duckdb::string_t>
                  ((DlbaEncoder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   writer,(string_t *)in_RDI);
      }
    }
    break;
  case (WriteStream *)0x8:
    local_50 = in_R9;
    if ((pSVar2->dict_written_value & 1U) == 0) {
      for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
        if (bVar1) {
          WriteStream::Write<unsigned_char>
                    ((WriteStream *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f);
          RleBpEncoder::BeginWrite(&pSVar2->dict_encoder);
          pSVar2->dict_written_value = true;
          break;
        }
      }
    }
    for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      if (bVar1) {
        PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
        GetIndex(in_stack_fffffffffffffe30,
                 (string_t *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
        RleBpEncoder::WriteValue
                  (in_stack_fffffffffffffe40,(WriteStream *)in_stack_fffffffffffffe38,
                   (uint32_t *)in_stack_fffffffffffffe30);
      }
    }
    break;
  case (WriteStream *)0x9:
    local_138 = in_R9;
    if ((pSVar2->bss_initialized & 1U) != 0) {
      in_stack_fffffffffffffe40 = (RleBpEncoder *)&pSVar2->bss_encoder;
      pCVar4 = ParquetWriter::GetContext((ParquetWriter *)in_RDI->bit_width);
      duckdb::BufferAllocator::Get(pCVar4);
      BssEncoder::BeginWrite(in_RDI,in_stack_fffffffffffffe48);
      pSVar2->bss_initialized = true;
    }
    for (; local_138 < in_stack_00000008; local_138 = local_138 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      if (bVar1) {
        input_03.value.pointer.ptr = (char *)extraout_RDX_03;
        input_03.value._0_8_ = psVar3[local_138].value.pointer.ptr;
        ParquetBaseStringOperator::Operation<duckdb::string_t,duckdb::string_t>
                  (*(ParquetBaseStringOperator **)&psVar3[local_138].value,input_03);
        target_value_04.value.pointer.ptr = (char *)in_stack_fffffffffffffe40;
        target_value_04.value._0_8_ = in_stack_fffffffffffffe38;
        ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                  ((ColumnWriterStatistics *)in_stack_fffffffffffffe30,target_value_04);
        BssEncoder::WriteValue<duckdb::string_t>
                  ((BssEncoder *)in_stack_fffffffffffffe40,(string_t *)in_stack_fffffffffffffe38);
      }
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}